

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationSubContext::~IfcGeometricRepresentationSubContext
          (IfcGeometricRepresentationSubContext *this)

{
  _func_int *p_Var1;
  char *pcVar2;
  _func_int *p_Var3;
  
  p_Var3 = (this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
           _vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                   _vptr_ObjectHelper + (long)p_Var3);
  pcVar2 = (this->UserDefinedTargetView).ptr.field_2._M_local_buf + (long)p_Var3;
  pcVar2[-0x100] = -0x78;
  pcVar2[-0xff] = '}';
  pcVar2[-0xfe] = -0x6e;
  pcVar2[-0xfd] = '\0';
  pcVar2[-0xfc] = '\0';
  pcVar2[-0xfb] = '\0';
  pcVar2[-0xfa] = '\0';
  pcVar2[-0xf9] = '\0';
  pcVar2[0x18] = '\0';
  pcVar2[0x19] = '~';
  pcVar2[0x1a] = -0x6e;
  pcVar2[0x1b] = '\0';
  pcVar2[0x1c] = '\0';
  pcVar2[0x1d] = '\0';
  pcVar2[0x1e] = '\0';
  pcVar2[0x1f] = '\0';
  pcVar2[-0xa0] = -0x50;
  pcVar2[-0x9f] = '}';
  pcVar2[-0x9e] = -0x6e;
  pcVar2[-0x9d] = '\0';
  pcVar2[-0x9c] = '\0';
  pcVar2[-0x9b] = '\0';
  pcVar2[-0x9a] = '\0';
  pcVar2[-0x99] = '\0';
  pcVar2[-0x58] = -0x28;
  pcVar2[-0x57] = '}';
  pcVar2[-0x56] = -0x6e;
  pcVar2[-0x55] = '\0';
  pcVar2[-0x54] = '\0';
  pcVar2[-0x53] = '\0';
  pcVar2[-0x52] = '\0';
  pcVar2[-0x51] = '\0';
  if (*(char **)(pcVar2 + -0x10) != pcVar2) {
    operator_delete(*(char **)(pcVar2 + -0x10));
  }
  if (*(code **)(p_Var1 + 0xd0) != p_Var1 + 0xe0) {
    operator_delete(*(code **)(p_Var1 + 0xd0));
  }
  *(undefined8 *)p_Var1 = 0x927ea0;
  *(undefined8 *)(p_Var1 + 0x118) = 0x927ef0;
  *(undefined8 *)(p_Var1 + 0x60) = 0x927ec8;
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x90) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x90));
  }
  *(undefined8 *)p_Var1 = 0x927f18;
  *(undefined8 *)(p_Var1 + 0x118) = 0x927f40;
  if (*(code **)(p_Var1 + 0x38) != p_Var1 + 0x48) {
    operator_delete(*(code **)(p_Var1 + 0x38));
  }
  if (*(code **)(p_Var1 + 0x10) != p_Var1 + 0x20) {
    operator_delete(*(code **)(p_Var1 + 0x10));
    return;
  }
  return;
}

Assistant:

IfcGeometricRepresentationSubContext() : Object("IfcGeometricRepresentationSubContext") {}